

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * dbReallocFinish(sqlite3 *db,void *p,u64 n)

{
  int iVar1;
  void *pvVar2;
  
  if (db->mallocFailed == '\0') {
    if ((p < (db->lookaside).pStart) || ((db->lookaside).pEnd <= p)) {
      iVar1 = sqlite3_initialize();
      if ((iVar1 == 0) && (pvVar2 = sqlite3Realloc(p,n), pvVar2 != (void *)0x0)) {
        return pvVar2;
      }
      sqlite3OomFault(db);
    }
    else {
      pvVar2 = sqlite3DbMallocRawNN(db,n);
      if (pvVar2 != (void *)0x0) {
        memcpy(pvVar2,p,(ulong)(db->lookaside).sz);
        if (p == (void *)0x0) {
          return pvVar2;
        }
        sqlite3DbFreeNN(db,p);
        return pvVar2;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

static SQLITE_NOINLINE void *dbReallocFinish(sqlite3 *db, void *p, u64 n){
  void *pNew = 0;
  assert( db!=0 );
  assert( p!=0 );
  if( db->mallocFailed==0 ){
    if( isLookaside(db, p) ){
      pNew = sqlite3DbMallocRawNN(db, n);
      if( pNew ){
        memcpy(pNew, p, db->lookaside.sz);
        sqlite3DbFree(db, p);
      }
    }else{
      assert( sqlite3MemdebugHasType(p, (MEMTYPE_LOOKASIDE|MEMTYPE_HEAP)) );
      assert( sqlite3MemdebugNoType(p, (u8)~(MEMTYPE_LOOKASIDE|MEMTYPE_HEAP)) );
      sqlite3MemdebugSetType(p, MEMTYPE_HEAP);
      pNew = sqlite3_realloc64(p, n);
      if( !pNew ){
        sqlite3OomFault(db);
      }
      sqlite3MemdebugSetType(pNew,
            (db->lookaside.bDisable==0 ? MEMTYPE_LOOKASIDE : MEMTYPE_HEAP));
    }
  }
  return pNew;
}